

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void soul::heart::Printer::print(Program *p,CodePrinter *out)

{
  bool bVar1;
  CodePrinter *pCVar2;
  char *s;
  int64_t v;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  Module *m;
  PrinterStream local_98;
  pool_ref *local_38;
  pool_ref<soul::Module> *module;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  CodePrinter *out_local;
  Program *p_local;
  
  pCVar2 = choc::text::CodePrinter::operator<<(out,'#');
  s = getHEARTFormatVersionPrefix();
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,s);
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,' ');
  v = getHEARTFormatVersion();
  pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,v);
  choc::text::CodePrinter::operator<<(pCVar2,(BlankLine *)&blankLine);
  this = Program::getModules(p);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  module = (pool_ref<soul::Module> *)
           std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&module);
    if (!bVar1) break;
    local_38 = (pool_ref *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator*(&__end2);
    m = pool_ref::operator_cast_to_Module_(local_38);
    PrinterStream::PrinterStream(&local_98,m,out);
    PrinterStream::printAll(&local_98);
    PrinterStream::~PrinterStream(&local_98);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void print (const Program& p, choc::text::CodePrinter& out)
    {
        out << '#' << getHEARTFormatVersionPrefix() << ' ' << getHEARTFormatVersion() << blankLine;

        for (auto& module : p.getModules())
            PrinterStream (module, out).printAll();
    }